

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O0

int ctz64(uint64_t val)

{
  undefined4 local_14;
  uint64_t val_local;
  
  if (val == 0) {
    local_14 = 0x40;
  }
  else {
    local_14 = 0;
    for (; (val & 1) == 0; val = val >> 1 | 0x8000000000000000) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

static inline int ctz64(uint64_t val)
{
#ifndef _MSC_VER
    return val ? __builtin_ctzll(val) : 64;
#else
    int cnt;

    cnt = 0;
    if (!((uint32_t)val)) {
        cnt += 32;
        val >>= 32;
    }

    return cnt + ctz32((uint32_t)val);
#endif
}